

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bad_alloc *anon_var_1;
  string local_260 [39];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  _union_1457 _Stack_178;
  sigaction sa;
  allocator local_d1;
  string local_d0 [55];
  allocator local_99;
  string local_98 [32];
  int local_78;
  int local_74;
  int processid;
  int opt;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  bool parquetOutput;
  FILE *fout [2];
  bool local_1a;
  bool local_19;
  bool ordOutput;
  bool skipHeader;
  char **argv_local;
  int argc_local;
  
  progname = *argv;
  local_19 = false;
  local_1a = false;
  memset(&stack0xffffffffffffffc8,0,0x10);
  parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&processid);
  local_78 = 0;
  do {
    local_74 = getopt(argc,argv,"vshP:M:m:Q:q:");
    pcVar1 = _optarg;
    if (local_74 == -1) {
      if ((parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
        fprintf(_stderr,
                "FATAL: Apache arrow libraries for parquet output are missing.\nPlease install libraries and recompile to use this option.\n"
               );
        exit(1);
      }
      sa.sa_mask.__val[0xe] = 0;
      sa.sa_mask.__val[0xf] = 0;
      sa.sa_mask.__val[0xc] = 0;
      sa.sa_mask.__val[0xd] = 0;
      sa.sa_mask.__val[10] = 0;
      sa.sa_mask.__val[0xb] = 0;
      sa.sa_mask.__val[8] = 0;
      sa.sa_mask.__val[9] = 0;
      sa.sa_mask.__val[6] = 0;
      sa.sa_mask.__val[7] = 0;
      sa.sa_mask.__val[4] = 0;
      sa.sa_mask.__val[5] = 0;
      sa.sa_mask.__val[2] = 0;
      sa.sa_mask.__val[3] = 0;
      sa.sa_mask.__val[0] = 0;
      sa.sa_mask.__val[1] = 0;
      _Stack_178.sa_handler = (__sighandler_t)0x0;
      sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
      sa.sa_flags = 0;
      sa._140_4_ = 0;
      sigemptyset((sigset_t *)&sa);
      _Stack_178.sa_handler = segfault_sigaction;
      sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,4);
      sigaction(0xb,(sigaction *)&_Stack_178,(sigaction *)0x0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"",&local_199);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"",&local_1c1);
      initstreams((string *)local_198,(string *)local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
      eltcalc::setinitdone(local_78);
      pcVar1 = progname;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,pcVar1,&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"INFO",&local_211);
      logprintf((string *)local_1e8,(string *)local_210,"starting process..\n");
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      eltcalc::doit(local_19,local_1a,(FILE **)&stack0xffffffffffffffc8,
                    (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&processid);
      pcVar1 = progname;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,pcVar1,&local_239);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"INFO",(allocator *)((long)&anon_var_1 + 7));
      logprintf((string *)local_238,(string *)local_260,"finishing process..\n");
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_1 + 7));
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      anon_var_1._0_4_ = 1;
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&processid);
      return 0;
    }
    switch(local_74) {
    case 0x4d:
      local_1a = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,pcVar1,&local_99);
      openpipe(0,(string *)local_98,(FILE **)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      break;
    case 0x50:
      local_78 = atoi(_optarg);
      break;
    case 0x51:
      local_1a = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,pcVar1,&local_d1);
      openpipe(1,(string *)local_d0,(FILE **)&stack0xffffffffffffffc8);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      break;
    case 0x68:
    default:
      help();
      exit(1);
    case 0x6d:
      parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    case 0x71:
      parquetOutFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      break;
    case 0x73:
      local_19 = true;
      break;
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      exit(1);
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];

	enum { MELT = 0, QELT };

	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	int opt;
	int processid = 0;
	while ((opt = getopt(argc, argv, "vshP:M:m:Q:q:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MELT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MELT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QELT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QELT] = optarg;
#endif
			break;
		case 'P':
			processid = atoi(optarg);
			break;
		case 's':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif
	try {
		initstreams();
		eltcalc::setinitdone(processid);
        	logprintf(progname, "INFO", "starting process..\n");
		eltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
        	logprintf(progname, "INFO", "finishing process..\n");
		return EXIT_SUCCESS;
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}

}